

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O0

void __thiscall xmrig::OclBackend::stop(OclBackend *this)

{
  undefined *puVar1;
  bool bVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  Workers<xmrig::OclLaunchData> *in_stack_00000010;
  uint64_t ts;
  vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *in_stack_fffffffffffffff0;
  
  bVar2 = std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::empty
                    (in_stack_fffffffffffffff0);
  if (!bVar2) {
    uVar3 = Chrono::steadyMSecs();
    Workers<xmrig::OclLaunchData>::stop(in_stack_00000010);
    std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::clear
              ((vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *)0x20ae49);
    OclSharedState::release();
    puVar1 = tag;
    uVar4 = Chrono::steadyMSecs();
    Log::print(INFO,"%s\x1b[0;33m stopped\x1b[0m\x1b[1;30m (%lu ms)\x1b[0m",puVar1,uVar4 - uVar3);
  }
  return;
}

Assistant:

void xmrig::OclBackend::stop()
{
    if (d_ptr->threads.empty()) {
        return;
    }

    const uint64_t ts = Chrono::steadyMSecs();

    d_ptr->workers.stop();
    d_ptr->threads.clear();

    OclSharedState::release();

    LOG_INFO("%s" YELLOW(" stopped") BLACK_BOLD(" (%" PRIu64 " ms)"), tag, Chrono::steadyMSecs() - ts);
}